

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall
crawler::JsonParser::parseLiteralness(JsonParser *this,string *literal,JsonType jsonType)

{
  size_type sVar1;
  size_t __n;
  int iVar2;
  runtime_error *this_00;
  string compareData;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  sVar1 = literal->_M_string_length;
  std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
  __n = literal->_M_string_length;
  if (__n == local_40) {
    if (__n != 0) {
      iVar2 = bcmp((literal->_M_dataplus)._M_p,local_48,__n);
      if (iVar2 != 0) goto LAB_0012066e;
    }
    this->pos = this->pos + sVar1;
    (this->jsonValue).type = jsonType;
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    return;
  }
LAB_0012066e:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"PARSE_INVALID_VALUE");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void crawler::JsonParser::parseLiteralness(const std::string &literal,
                                           crawler::JsonType jsonType) {
  size_t literalSize = literal.size();
  std::string compareData = json.substr(pos, literalSize);
  if (literal != compareData) {
    throw std::runtime_error("PARSE_INVALID_VALUE");
  }
  // move `pos` steps forward
  pos += literalSize;
  this->jsonValue.setType(jsonType);
}